

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

StringView __thiscall Corrade::Containers::String::findOr(String *this,char character,char *fail)

{
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> BStack_28;
  
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&BStack_28,this);
  BVar1 = BasicStringView<const_char>::findOr(&BStack_28,character,fail);
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findOr(const char character, const char* const fail) const {
    return StringView{*this}.findOr(character, fail);
}